

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_clip_bary3(REF_DBL *orig_bary,REF_DBL *bary)

{
  undefined1 auVar1 [16];
  long lVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  char *pcVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  
  dVar9 = 0.0;
  if (0.0 <= *orig_bary) {
    dVar9 = *orig_bary;
  }
  *bary = dVar9;
  dVar11 = 0.0;
  if (0.0 <= orig_bary[1]) {
    dVar11 = orig_bary[1];
  }
  bary[1] = dVar11;
  dVar8 = 0.0;
  if (0.0 <= orig_bary[2]) {
    dVar8 = orig_bary[2];
  }
  bary[2] = dVar8;
  dVar7 = dVar9 + dVar11 + dVar8;
  auVar13._0_8_ = dVar7 * 1e+20;
  auVar13._8_8_ = dVar9;
  auVar14._8_8_ = -dVar9;
  auVar14._0_8_ = -auVar13._0_8_;
  auVar14 = maxpd(auVar13,auVar14);
  dVar12 = auVar14._0_8_;
  if (auVar14._8_8_ < dVar12) {
    dVar15 = dVar11;
    if (dVar11 <= -dVar11) {
      dVar15 = -dVar11;
    }
    if (dVar15 < dVar12) {
      dVar15 = dVar8;
      if (dVar8 <= -dVar8) {
        dVar15 = -dVar8;
      }
      if (dVar15 < dVar12) {
        auVar10._8_8_ = dVar11;
        auVar10._0_8_ = dVar9;
        auVar1._8_8_ = dVar7;
        auVar1._0_8_ = dVar7;
        auVar14 = divpd(auVar10,auVar1);
        *(undefined1 (*) [16])bary = auVar14;
        bary[2] = dVar8 / dVar7;
        if (0.0 <= auVar14._0_8_) {
          if (0.0 <= auVar14._8_8_) {
            if (0.0 <= dVar8 / dVar7) {
              return 0;
            }
            pcVar6 = "bary[2] not positive";
            uVar5 = 0xbd5;
          }
          else {
            pcVar6 = "bary[1] not positive";
            uVar5 = 0xbd4;
          }
        }
        else {
          pcVar6 = "bary[0] not positive";
          uVar5 = 0xbd3;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               uVar5,"ref_node_clip_bary3",pcVar6);
        return 1;
      }
    }
  }
  printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e %.18e\n",dVar7,*orig_bary,orig_bary[1],
         orig_bary[2],
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xbc6,
         "ref_node_clip_bary3");
  printf("clipped bary\n%.18e %.18e %.18e\n",*bary,bary[1],bary[2]);
  iVar4 = 0;
  for (lVar2 = 1; lVar2 != 3; lVar2 = lVar2 + 1) {
    iVar3 = (int)lVar2;
    if (bary[lVar2] < bary[iVar4] || bary[lVar2] == bary[iVar4]) {
      iVar3 = iVar4;
    }
    iVar4 = iVar3;
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    bary[lVar2] = 0.0;
  }
  bary[iVar4] = 1.0;
  printf("modified bary\n%.18e %.18e %.18e\n",*bary,bary[1],bary[2]);
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_node_clip_bary3(REF_DBL *orig_bary, REF_DBL *bary) {
  REF_DBL total;

  bary[0] = MAX(0.0, orig_bary[0]);
  bary[1] = MAX(0.0, orig_bary[1]);
  bary[2] = MAX(0.0, orig_bary[2]);

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
  } else {
    REF_INT i, largest;
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, orig_bary[0], orig_bary[1],
           orig_bary[2]);
    printf("clipped bary\n%.18e %.18e %.18e\n", bary[0], bary[1], bary[2]);
    /* chose one node */
    largest = 0;
    for (i = 1; i < 3; i++)
      if (bary[i] > bary[largest]) largest = i;
    for (i = 0; i < 3; i++) bary[i] = 0.0;
    bary[largest] = 1.0;
    printf("modified bary\n%.18e %.18e %.18e\n", bary[0], bary[1], bary[2]);
    return REF_DIV_ZERO;
  }

  RAS(bary[0] >= 0.0, "bary[0] not positive");
  RAS(bary[1] >= 0.0, "bary[1] not positive");
  RAS(bary[2] >= 0.0, "bary[2] not positive");

  return REF_SUCCESS;
}